

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O1

void __thiscall rsg::ValueRange::ValueRange(ValueRange *this,VariableType *type)

{
  int iVar1;
  allocator_type local_1a;
  allocator_type local_19;
  
  VariableType::VariableType(&this->m_type,type);
  iVar1 = VariableType::getScalarSize(type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_min,(long)iVar1,&local_19)
  ;
  iVar1 = VariableType::getScalarSize(type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_max,(long)iVar1,&local_1a)
  ;
  return;
}

Assistant:

ValueRange::ValueRange (const VariableType& type)
	: m_type		(type)
	, m_min			(type.getScalarSize())
	, m_max			(type.getScalarSize())
{
}